

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

bool __thiscall mkvparser::Tags::Tag::ExpandSimpleTagsArray(Tag *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  undefined8 uVar4;
  int iVar5;
  long *plVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  SimpleTag *pSVar10;
  SimpleTag *pSVar11;
  bool bVar12;
  
  iVar3 = this->m_simple_tags_size;
  bVar12 = true;
  if (iVar3 <= this->m_simple_tags_count) {
    iVar5 = 1;
    if (iVar3 != 0) {
      iVar5 = iVar3 * 2;
    }
    lVar9 = (long)iVar5 * 0x10;
    uVar8 = 0xffffffffffffffff;
    if (-1 < iVar5) {
      uVar8 = lVar9 + 8;
    }
    plVar6 = (long *)operator_new__(uVar8,(nothrow_t *)&std::nothrow);
    if (plVar6 == (long *)0x0) {
      pSVar10 = (SimpleTag *)0x0;
    }
    else {
      *plVar6 = (long)iVar5;
      pSVar10 = (SimpleTag *)(plVar6 + 1);
      lVar7 = 0;
      pSVar11 = pSVar10;
      do {
        SimpleTag::SimpleTag(pSVar11);
        lVar7 = lVar7 + -0x10;
        pSVar11 = pSVar11 + 1;
      } while (-lVar7 != lVar9);
    }
    bVar12 = pSVar10 != (SimpleTag *)0x0;
    if (bVar12) {
      iVar3 = this->m_simple_tags_count;
      if (0 < (long)iVar3) {
        pSVar11 = this->m_simple_tags;
        lVar9 = 0;
        do {
          puVar1 = (undefined8 *)((long)&pSVar11->m_tag_name + lVar9);
          uVar4 = puVar1[1];
          puVar2 = (undefined8 *)((long)&pSVar10->m_tag_name + lVar9);
          *puVar2 = *puVar1;
          puVar2[1] = uVar4;
          lVar9 = lVar9 + 0x10;
        } while ((long)iVar3 * 0x10 != lVar9);
      }
      pSVar11 = this->m_simple_tags;
      if (pSVar11 != (SimpleTag *)0x0) {
        if (pSVar11[-1].m_tag_string != (char *)0x0) {
          lVar9 = (long)pSVar11[-1].m_tag_string << 4;
          do {
            SimpleTag::~SimpleTag((SimpleTag *)((long)&pSVar11[-1].m_tag_name + lVar9));
            lVar9 = lVar9 + -0x10;
          } while (lVar9 != 0);
        }
        operator_delete__(&pSVar11[-1].m_tag_string);
      }
      this->m_simple_tags = pSVar10;
      this->m_simple_tags_size = iVar5;
    }
  }
  return bVar12;
}

Assistant:

bool Tags::Tag::ExpandSimpleTagsArray() {
  if (m_simple_tags_size > m_simple_tags_count)
    return true;  // nothing else to do

  const int size = (m_simple_tags_size == 0) ? 1 : 2 * m_simple_tags_size;

  SimpleTag* const displays = new (std::nothrow) SimpleTag[size];

  if (displays == NULL)
    return false;

  for (int idx = 0; idx < m_simple_tags_count; ++idx) {
    m_simple_tags[idx].ShallowCopy(displays[idx]);
  }

  delete[] m_simple_tags;
  m_simple_tags = displays;

  m_simple_tags_size = size;
  return true;
}